

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

UBool __thiscall icu_63::PluralRules::operator==(PluralRules *this,PluralRules *other)

{
  UErrorCode *status_00;
  UBool UVar1;
  int iVar2;
  int iVar3;
  StringEnumeration *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LocalPointerBase<icu_63::StringEnumeration> local_40;
  LocalPointer<icu_63::StringEnumeration> otherKeywordList;
  LocalPointer<icu_63::StringEnumeration> myKeywordList;
  UErrorCode status;
  UnicodeString *ptrKeyword;
  PluralRules *other_local;
  PluralRules *this_local;
  
  myKeywordList.super_LocalPointerBase<icu_63::StringEnumeration>.ptr._4_4_ = U_ZERO_ERROR;
  if (this == other) {
    return '\x01';
  }
  status_00 = (UErrorCode *)
              ((long)&myKeywordList.super_LocalPointerBase<icu_63::StringEnumeration>.ptr + 4);
  pSVar4 = getKeywords(this,status_00);
  LocalPointer<icu_63::StringEnumeration>::LocalPointer(&otherKeywordList,pSVar4);
  pSVar4 = getKeywords(other,status_00);
  LocalPointer<icu_63::StringEnumeration>::LocalPointer
            ((LocalPointer<icu_63::StringEnumeration> *)&local_40,pSVar4);
  UVar1 = ::U_FAILURE(myKeywordList.super_LocalPointerBase<icu_63::StringEnumeration>.ptr._4_4_);
  if (UVar1 == '\0') {
    pSVar4 = LocalPointerBase<icu_63::StringEnumeration>::operator->
                       (&otherKeywordList.super_LocalPointerBase<icu_63::StringEnumeration>);
    iVar2 = (*(pSVar4->super_UObject)._vptr_UObject[4])
                      (pSVar4,(undefined1 *)
                              ((long)&myKeywordList.
                                      super_LocalPointerBase<icu_63::StringEnumeration>.ptr + 4));
    pSVar4 = LocalPointerBase<icu_63::StringEnumeration>::operator->(&local_40);
    iVar3 = (*(pSVar4->super_UObject)._vptr_UObject[4])
                      (pSVar4,(undefined1 *)
                              ((long)&myKeywordList.
                                      super_LocalPointerBase<icu_63::StringEnumeration>.ptr + 4));
    if (iVar2 == iVar3) {
      pSVar4 = LocalPointerBase<icu_63::StringEnumeration>::operator->
                         (&otherKeywordList.super_LocalPointerBase<icu_63::StringEnumeration>);
      (*(pSVar4->super_UObject)._vptr_UObject[8])
                (pSVar4,(undefined1 *)
                        ((long)&myKeywordList.super_LocalPointerBase<icu_63::StringEnumeration>.ptr
                        + 4));
      do {
        pSVar4 = LocalPointerBase<icu_63::StringEnumeration>::operator->
                           (&otherKeywordList.super_LocalPointerBase<icu_63::StringEnumeration>);
        iVar2 = (*(pSVar4->super_UObject)._vptr_UObject[7])
                          (pSVar4,(undefined1 *)
                                  ((long)&myKeywordList.
                                          super_LocalPointerBase<icu_63::StringEnumeration>.ptr + 4)
                          );
        if ((UnicodeString *)CONCAT44(extraout_var,iVar2) == (UnicodeString *)0x0) {
          pSVar4 = LocalPointerBase<icu_63::StringEnumeration>::operator->(&local_40);
          (*(pSVar4->super_UObject)._vptr_UObject[8])
                    (pSVar4,(undefined1 *)
                            ((long)&myKeywordList.super_LocalPointerBase<icu_63::StringEnumeration>.
                                    ptr + 4));
          goto LAB_0035628e;
        }
        UVar1 = isKeyword(other,(UnicodeString *)CONCAT44(extraout_var,iVar2));
      } while (UVar1 != '\0');
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  goto LAB_0035632e;
  while (UVar1 = isKeyword(this,(UnicodeString *)CONCAT44(extraout_var_00,iVar2)), UVar1 != '\0') {
LAB_0035628e:
    pSVar4 = LocalPointerBase<icu_63::StringEnumeration>::operator->(&local_40);
    iVar2 = (*(pSVar4->super_UObject)._vptr_UObject[7])
                      (pSVar4,(undefined1 *)
                              ((long)&myKeywordList.
                                      super_LocalPointerBase<icu_63::StringEnumeration>.ptr + 4));
    if ((UnicodeString *)CONCAT44(extraout_var_00,iVar2) == (UnicodeString *)0x0) {
      UVar1 = ::U_FAILURE(myKeywordList.super_LocalPointerBase<icu_63::StringEnumeration>.ptr._4_4_)
      ;
      if (UVar1 == '\0') {
        this_local._7_1_ = '\x01';
      }
      else {
        this_local._7_1_ = '\0';
      }
      goto LAB_0035632e;
    }
  }
  this_local._7_1_ = '\0';
LAB_0035632e:
  LocalPointer<icu_63::StringEnumeration>::~LocalPointer
            ((LocalPointer<icu_63::StringEnumeration> *)&local_40);
  LocalPointer<icu_63::StringEnumeration>::~LocalPointer(&otherKeywordList);
  return this_local._7_1_;
}

Assistant:

UBool
PluralRules::operator==(const PluralRules& other) const  {
    const UnicodeString *ptrKeyword;
    UErrorCode status= U_ZERO_ERROR;

    if ( this == &other ) {
        return TRUE;
    }
    LocalPointer<StringEnumeration> myKeywordList(getKeywords(status));
    LocalPointer<StringEnumeration> otherKeywordList(other.getKeywords(status));
    if (U_FAILURE(status)) {
        return FALSE;
    }

    if (myKeywordList->count(status)!=otherKeywordList->count(status)) {
        return FALSE;
    }
    myKeywordList->reset(status);
    while ((ptrKeyword=myKeywordList->snext(status))!=nullptr) {
        if (!other.isKeyword(*ptrKeyword)) {
            return FALSE;
        }
    }
    otherKeywordList->reset(status);
    while ((ptrKeyword=otherKeywordList->snext(status))!=nullptr) {
        if (!this->isKeyword(*ptrKeyword)) {
            return FALSE;
        }
    }
    if (U_FAILURE(status)) {
        return FALSE;
    }

    return TRUE;
}